

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

Expr sum_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                Expr *args,int argc)

{
  ValueType VVar1;
  Expr *__ptr;
  anon_union_8_8_707b72ea_for_Expr_1 *paVar3;
  long lVar4;
  Expr EVar5;
  Expr a;
  Expr b;
  anon_union_8_8_707b72ea_for_Expr_1 aVar2;
  
  if (argc == 0) {
    EVar5 = make_int_zero(exec);
    aVar2 = EVar5.field_1;
    VVar1 = EVar5.type;
  }
  else {
    __ptr = exec_eval_each(exec,callContext,args,argc);
    VVar1 = __ptr->type;
    aVar2 = (anon_union_8_8_707b72ea_for_Expr_1)(__ptr->field_1).val_atom;
    paVar3 = &__ptr[1].field_1;
    for (lVar4 = 1; lVar4 < argc; lVar4 = lVar4 + 1) {
      b._4_4_ = 0;
      b.type = ((Expr *)(paVar3 + -1))->type;
      a._4_4_ = 0;
      a.type = VVar1;
      a.field_1.val_atom = aVar2.val_atom;
      b.field_1.val_atom = paVar3->val_atom;
      EVar5 = exec_sum(exec,a,b);
      aVar2 = EVar5.field_1;
      VVar1 = EVar5.type;
      paVar3 = paVar3 + 2;
    }
    free(__ptr);
  }
  EVar5._4_4_ = 0;
  EVar5.type = VVar1;
  EVar5.field_1.val_atom = aVar2.val_atom;
  return EVar5;
}

Assistant:

BUILTIN_FUNC(sum_builtin)
{
    if (argc == 0)
        return make_int_zero(exec);

    Expr *values = exec_eval_each(exec, callContext, args, argc);

    Expr num = values[0];
    for (int i = 1; i < argc; i++)
        num = exec_sum(exec, num, values[i]);

    free(values);
    return num;
}